

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O1

RGB __thiscall
RayTracer::processPixelOnSphere
          (RayTracer *this,Point *rayBeg,Point *pointOnSphere,const_iterator sphereIt,
          int recursionLevel)

{
  Point *light;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  Plane *pPVar7;
  bool bVar8;
  RGB RVar9;
  uint uVar10;
  Sphere *pSVar11;
  Sphere *object;
  Plane *object_00;
  bool bVar12;
  float fVar13;
  undefined1 local_80 [8];
  Segment refl;
  
  light = &(this->super_RayTracerBase).config.super_BaseConfig.light;
  pSVar11 = (this->super_RayTracerBase).config.spheres.
            super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
            _M_start;
  bVar12 = pSVar11 != sphereIt._M_current;
  if (bVar12) {
    bVar8 = pointInShadow<Sphere>(pointOnSphere,light,pSVar11);
    while (!bVar8) {
      pSVar11 = pSVar11 + 1;
      bVar12 = pSVar11 != sphereIt._M_current;
      if (pSVar11 == sphereIt._M_current) break;
      bVar8 = pointInShadow<Sphere>(pointOnSphere,light,pSVar11);
    }
  }
  if (!bVar12) {
    pSVar11 = (this->super_RayTracerBase).config.spheres.
              super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    bVar12 = sphereIt._M_current + 1 != pSVar11;
    if ((bVar12) &&
       (bVar8 = pointInShadow<Sphere>(pointOnSphere,light,sphereIt._M_current + 1), !bVar8)) {
      object = sphereIt._M_current + 2;
      do {
        bVar12 = object != pSVar11;
        if (object == pSVar11) break;
        bVar8 = pointInShadow<Sphere>(pointOnSphere,light,object);
        object = object + 1;
      } while (!bVar8);
    }
    if (!bVar12) {
      object_00 = (this->super_RayTracerBase).config.planes.
                  super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      pPVar7 = (this->super_RayTracerBase).config.planes.
               super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      bVar12 = object_00 != pPVar7;
      if (bVar12) {
        bVar8 = pointInShadow<Plane>(pointOnSphere,light,object_00);
        while (!bVar8) {
          object_00 = object_00 + 1;
          bVar12 = object_00 != pPVar7;
          if (object_00 == pPVar7) break;
          bVar8 = pointInShadow<Plane>(pointOnSphere,light,object_00);
        }
      }
      if (!bVar12) {
        uVar2 = pointOnSphere->x;
        uVar4 = pointOnSphere->y;
        fVar1 = (sphereIt._M_current)->radius;
        refl.a.x = (pointOnSphere->z - ((sphereIt._M_current)->center).z) / fVar1;
        local_80._4_4_ = ((float)uVar4 - ((sphereIt._M_current)->center).y) / fVar1;
        local_80._0_4_ = ((float)uVar2 - ((sphereIt._M_current)->center).x) / fVar1;
        uVar3 = (this->super_RayTracerBase).config.super_BaseConfig.light.x;
        uVar5 = (this->super_RayTracerBase).config.super_BaseConfig.light.y;
        refl.b.z = (float)uVar5 - pointOnSphere->y;
        refl.b.y = (float)uVar3 - pointOnSphere->x;
        RVar9 = calculateColorInLight
                          (this,(sphereIt._M_current)->color,(Vector *)local_80,(Vector *)&refl.b.y)
        ;
        uVar10 = (uint)(uint3)RVar9;
        goto LAB_00105218;
      }
    }
  }
  uVar6._0_1_ = ((sphereIt._M_current)->color).r;
  uVar6._1_1_ = ((sphereIt._M_current)->color).g;
  fVar1 = (this->super_RayTracerBase).config.super_BaseConfig.ambientCoefficient;
  uVar10 = (int)((float)(uVar6 & 0xff) * fVar1) & 0xffU |
           ((int)((float)(uVar6 >> 8) * fVar1) & 0xffU) << 8 |
           (int)((float)((sphereIt._M_current)->color).b * fVar1) << 0x10;
LAB_00105218:
  if ((recursionLevel < (this->super_RayTracerBase).config.super_BaseConfig.maxRecursionLevel) &&
     (1.1920929e-07 <= ABS((sphereIt._M_current)->reflectionCoefficient))) {
    refl.b.y = rayBeg->x;
    refl.b.z = rayBeg->y;
    reflection((Segment *)local_80,(Segment *)&refl.b.y,sphereIt._M_current);
    RVar9 = processPixel(this,(Segment *)local_80,recursionLevel + 1);
    fVar1 = (sphereIt._M_current)->reflectionCoefficient;
    fVar13 = 1.0 - fVar1;
    uVar10 = (uint)(byte)((char)(int)((float)((uint3)RVar9 & 0xff) * fVar1) +
                         (char)(int)((float)(uVar10 & 0xff) * fVar13)) |
             (uint)(byte)((char)(int)((float)(RVar9._1_2_ & 0xff) * fVar1) +
                         (char)(int)((float)(uVar10 >> 8 & 0xff) * fVar13)) << 8 |
             (uint)(byte)((char)(int)((float)RVar9.b * fVar1) +
                         (char)(int)((float)(uVar10 >> 0x10 & 0xff) * fVar13)) << 0x10;
  }
  return SUB43(uVar10,0);
}

Assistant:

RGB RayTracer::processPixelOnSphere(Point const& rayBeg, Point const& pointOnSphere,
                                    std::vector<Sphere>::const_iterator sphereIt,
                                    int recursionLevel)
{
  bool const isInShadow =
      pointInShadow(pointOnSphere, config.light, config.spheres.cbegin(), sphereIt)
      || pointInShadow(pointOnSphere, config.light, sphereIt + 1, config.spheres.cend())
      || pointInShadow(pointOnSphere, config.light, config.planes.cbegin(), config.planes.cend());

  RGB resultCol;
  if (isInShadow)
    resultCol = sphereIt->color * config.ambientCoefficient;
  else
  {
    Vector const normalVec = (pointOnSphere - sphereIt->center) / sphereIt->radius;
    resultCol = calculateColorInLight(sphereIt->color, normalVec, config.light - pointOnSphere);
  }

  if (recursionLevel >= config.maxRecursionLevel || isCloseToZero(sphereIt->reflectionCoefficient))
    return resultCol;

  Segment refl = reflection({rayBeg, pointOnSphere}, *sphereIt);
  RGB reflectedColor = processPixel(refl, recursionLevel + 1);

  return calculateColorFromReflection(resultCol, reflectedColor, sphereIt->reflectionCoefficient);
}